

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_region.cpp
# Opt level: O0

shared_ptr<unsigned_char> __thiscall
anon_unknown.dwarf_1ca3d2::Region::make_array(Region *this,size_t size)

{
  void *pvVar1;
  ulong in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<unsigned_char> sVar2;
  size_t size_local;
  Region *this_local;
  
  pvVar1 = operator_new__(in_RDX);
  std::shared_ptr<unsigned_char>::
  shared_ptr<unsigned_char,(anonymous_namespace)::Region::make_array(unsigned_long)::_lambda(unsigned_char*)_1_,void>
            ((shared_ptr<unsigned_char> *)this,pvVar1);
  sVar2.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<unsigned_char>)
         sVar2.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<std::uint8_t> make_array (std::size_t size) {
            return std::shared_ptr<std::uint8_t>{new std::uint8_t[size],
                                                 [] (std::uint8_t * p) { delete[] p; }};
        }